

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O3

database_binder * sqlite::operator<<(database_binder *db,uint *val)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  undefined8 extraout_RAX;
  char *in_RCX;
  str_ref sql;
  int result;
  int local_3c;
  string local_38;
  
  psVar1 = (db->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
           super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
           super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl;
  iVar2 = database_binder::_next_index(db);
  local_3c = sqlite3_bind_int64(psVar1,iVar2,*val);
  if (local_3c == 0) {
    return db;
  }
  database_binder::sql_abi_cxx11_(&local_38,db);
  sql._M_str = in_RCX;
  sql._M_len = (size_t)local_38._M_dataplus._M_p;
  errors::throw_sqlite_error((errors *)&local_3c,(int *)local_38._M_string_length,sql);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

database_binder &operator<<(database_binder& db, T&& val) {
		int result = bind_col_in_db(db._stmt.get(), db._next_index(), std::forward<T>(val));
		if(result != SQLITE_OK)
			exceptions::throw_sqlite_error(result, db.sql());
		return db;
	}